

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O0

void help(int default_iters)

{
  uint in_EDI;
  
  printf("Benchmarks the following algorithms:\n");
  printf("    - ECDSA signing/verification\n");
  printf("    - ECDH key exchange (optional module)\n");
  printf("    - Schnorr signatures (optional module)\n");
  printf("    - ElligatorSwift (optional module)\n");
  printf("\n");
  printf("The default number of iterations for each benchmark is %d. This can be\n",(ulong)in_EDI);
  printf("customized using the SECP256K1_BENCH_ITERS environment variable.\n");
  printf("\n");
  printf("Usage: ./bench [args]\n");
  printf("By default, all benchmarks will be run.\n");
  printf("args:\n");
  printf("    help              : display this help and exit\n");
  printf("    ecdsa             : all ECDSA algorithms--sign, verify, recovery (if enabled)\n");
  printf("    ecdsa_sign        : ECDSA siging algorithm\n");
  printf("    ecdsa_verify      : ECDSA verification algorithm\n");
  printf("    ec                : all EC public key algorithms (keygen)\n");
  printf("    ec_keygen         : EC public key generation\n");
  printf("    ecdh              : ECDH key exchange algorithm\n");
  printf("    schnorrsig        : all Schnorr signature algorithms (sign, verify)\n");
  printf("    schnorrsig_sign   : Schnorr sigining algorithm\n");
  printf("    schnorrsig_verify : Schnorr verification algorithm\n");
  printf("    ellswift          : all ElligatorSwift benchmarks (encode, decode, keygen, ecdh)\n");
  printf("    ellswift_encode   : ElligatorSwift encoding\n");
  printf("    ellswift_decode   : ElligatorSwift decoding\n");
  printf("    ellswift_keygen   : ElligatorSwift key generation\n");
  printf("    ellswift_ecdh     : ECDH on ElligatorSwift keys\n");
  printf("\n");
  return;
}

Assistant:

static void help(int default_iters) {
    printf("Benchmarks the following algorithms:\n");
    printf("    - ECDSA signing/verification\n");

#ifdef ENABLE_MODULE_RECOVERY
    printf("    - Public key recovery (optional module)\n");
#endif

#ifdef ENABLE_MODULE_ECDH
    printf("    - ECDH key exchange (optional module)\n");
#endif

#ifdef ENABLE_MODULE_SCHNORRSIG
    printf("    - Schnorr signatures (optional module)\n");
#endif

#ifdef ENABLE_MODULE_ELLSWIFT
    printf("    - ElligatorSwift (optional module)\n");
#endif

    printf("\n");
    printf("The default number of iterations for each benchmark is %d. This can be\n", default_iters);
    printf("customized using the SECP256K1_BENCH_ITERS environment variable.\n");
    printf("\n");
    printf("Usage: ./bench [args]\n");
    printf("By default, all benchmarks will be run.\n");
    printf("args:\n");
    printf("    help              : display this help and exit\n");
    printf("    ecdsa             : all ECDSA algorithms--sign, verify, recovery (if enabled)\n");
    printf("    ecdsa_sign        : ECDSA siging algorithm\n");
    printf("    ecdsa_verify      : ECDSA verification algorithm\n");
    printf("    ec                : all EC public key algorithms (keygen)\n");
    printf("    ec_keygen         : EC public key generation\n");

#ifdef ENABLE_MODULE_RECOVERY
    printf("    ecdsa_recover     : ECDSA public key recovery algorithm\n");
#endif

#ifdef ENABLE_MODULE_ECDH
    printf("    ecdh              : ECDH key exchange algorithm\n");
#endif

#ifdef ENABLE_MODULE_SCHNORRSIG
    printf("    schnorrsig        : all Schnorr signature algorithms (sign, verify)\n");
    printf("    schnorrsig_sign   : Schnorr sigining algorithm\n");
    printf("    schnorrsig_verify : Schnorr verification algorithm\n");
#endif

#ifdef ENABLE_MODULE_ELLSWIFT
    printf("    ellswift          : all ElligatorSwift benchmarks (encode, decode, keygen, ecdh)\n");
    printf("    ellswift_encode   : ElligatorSwift encoding\n");
    printf("    ellswift_decode   : ElligatorSwift decoding\n");
    printf("    ellswift_keygen   : ElligatorSwift key generation\n");
    printf("    ellswift_ecdh     : ECDH on ElligatorSwift keys\n");
#endif

    printf("\n");
}